

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  pointer pcVar1;
  size_type sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  string suffix;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string wrappableInsteadOfChars;
  string wrappableAfterChars;
  string wrappableBeforeChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar3 = _attr->indent;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar3;
  (this->attr).width = _attr->width;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&wrappableBeforeChars,"[({<\t",(allocator *)&wrappableAfterChars);
  std::__cxx11::string::string
            ((string *)&wrappableAfterChars,"])}>-,./|\\",(allocator *)&wrappableInsteadOfChars);
  std::__cxx11::string::string((string *)&wrappableInsteadOfChars," \n\r",(allocator *)&indent);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  if (_attr->initialIndent == 0xffffffffffffffff) {
    std::__cxx11::string::_M_construct((ulong)&indent,(char)_attr->indent);
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&indent,(char)_attr->initialIndent);
  }
  pcVar12 = (_str->_M_dataplus)._M_p;
  pcVar9 = pcVar12 + _str->_M_string_length;
  do {
    if (pcVar12 == pcVar9) {
LAB_00126db3:
      std::__cxx11::string::~string((string *)&indent);
      std::__cxx11::string::~string((string *)&wrappableInsteadOfChars);
      std::__cxx11::string::~string((string *)&wrappableAfterChars);
      std::__cxx11::string::~string((string *)&wrappableBeforeChars);
      return;
    }
    if (0x7ce0 < (ulong)((long)(this->lines).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string
                ((string *)&suffix,"... message truncated due to excessive size",
                 (allocator *)&local_d0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
                 &suffix);
      std::__cxx11::string::~string((string *)&suffix);
      goto LAB_00126db3;
    }
    suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
    suffix._M_string_length = 0;
    suffix.field_2._M_local_buf[0] = '\0';
    uVar10 = _attr->width - indent._M_string_length;
    if ((ulong)((long)pcVar9 - (long)pcVar12) <= uVar10) {
      uVar10 = (long)pcVar9 - (long)pcVar12;
    }
    pcVar1 = (_str->_M_dataplus)._M_p;
    sVar2 = _str->_M_string_length;
    local_d0._M_dataplus._M_p._0_1_ = 10;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar12,pcVar12 + uVar10,&local_d0);
    pcVar13 = pcVar1 + sVar2;
    if (_Var7._M_current != pcVar9) {
      _Var11 = _Var7;
      pcVar14 = pcVar13;
      bVar5 = false;
      do {
        lVar8 = std::__cxx11::string::find
                          ((char)&wrappableAfterChars,(ulong)(uint)(int)*_Var11._M_current);
        if (_Var11._M_current == _Var7._M_current || lVar8 == -1) {
          if (pcVar12 < _Var11._M_current) {
            lVar8 = std::__cxx11::string::find
                              ((char)&wrappableBeforeChars,(ulong)(uint)(int)*_Var11._M_current);
            pcVar13 = _Var11._M_current;
            pcVar6 = _Var11._M_current;
            bVar4 = true;
            if (lVar8 != -1) goto LAB_00126c1a;
          }
          lVar8 = std::__cxx11::string::find
                            ((char)&wrappableInsteadOfChars,(ulong)(uint)(int)*_Var11._M_current);
          pcVar13 = pcVar14;
          pcVar6 = _Var7._M_current;
          bVar4 = bVar5;
          if (lVar8 != -1) {
            pcVar13 = _Var11._M_current + 1;
            bVar4 = true;
            pcVar6 = _Var11._M_current;
          }
        }
        else {
          pcVar13 = _Var11._M_current + 1;
          pcVar6 = _Var11._M_current + 1;
          bVar4 = true;
        }
LAB_00126c1a:
        _Var7._M_current = pcVar6;
        pcVar6 = _Var7._M_current;
        if (_Var11._M_current == pcVar12) {
          if (!bVar4) {
            std::__cxx11::string::assign((char *)&suffix);
            _Var7._M_current = _Var7._M_current + -1;
            pcVar13 = _Var7._M_current;
            goto LAB_00126cbf;
          }
          break;
        }
        _Var11._M_current = _Var11._M_current + -1;
        pcVar14 = pcVar13;
        bVar5 = bVar4;
      } while (!bVar4);
      do {
        _Var7._M_current = pcVar6;
        if (_Var7._M_current <= pcVar12) break;
        lVar8 = std::__cxx11::string::find
                          ((char)&wrappableInsteadOfChars,(ulong)(uint)(int)_Var7._M_current[-1]);
        pcVar6 = _Var7._M_current + -1;
      } while (lVar8 != -1);
    }
LAB_00126cbf:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_f0,pcVar12,_Var7._M_current);
    std::operator+(&local_50,&indent,&local_f0);
    std::operator+(&local_d0,&local_50,&suffix);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
               &local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    if (indent._M_string_length != _attr->indent) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d0,(char)_attr->indent);
      std::__cxx11::string::operator=((string *)&indent,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string((string *)&suffix);
    pcVar12 = pcVar13;
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            const std::string wrappableBeforeChars = "[({<\t";
            const std::string wrappableAfterChars = "])}>-,./|\\";
            const std::string wrappableInsteadOfChars = " \n\r";
            std::string indent = _attr.initialIndent != std::string::npos
                ? std::string( _attr.initialIndent, ' ' )
                : std::string( _attr.indent, ' ' );

            typedef std::string::const_iterator iterator;
            iterator it = _str.begin();
            const iterator strEnd = _str.end();

            while( it != strEnd ) {

                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }

                std::string suffix;
                std::size_t width = (std::min)( static_cast<size_t>( strEnd-it ), _attr.width-static_cast<size_t>( indent.size() ) );
                iterator itEnd = it+width;
                iterator itNext = _str.end();

                iterator itNewLine = std::find( it, itEnd, '\n' );
                if( itNewLine != itEnd )
                    itEnd = itNewLine;

                if( itEnd != strEnd  ) {
                    bool foundWrapPoint = false;
                    iterator findIt = itEnd;
                    do {
                        if( wrappableAfterChars.find( *findIt ) != std::string::npos && findIt != itEnd ) {
                            itEnd = findIt+1;
                            itNext = findIt+1;
                            foundWrapPoint = true;
                        }
                        else if( findIt > it && wrappableBeforeChars.find( *findIt ) != std::string::npos ) {
                            itEnd = findIt;
                            itNext = findIt;
                            foundWrapPoint = true;
                        }
                        else if( wrappableInsteadOfChars.find( *findIt ) != std::string::npos ) {
                            itNext = findIt+1;
                            itEnd = findIt;
                            foundWrapPoint = true;
                        }
                        if( findIt == it )
                            break;
                        else
                            --findIt;
                    }
                    while( !foundWrapPoint );

                    if( !foundWrapPoint ) {
                        // No good wrap char, so we'll break mid word and add a hyphen
                        --itEnd;
                        itNext = itEnd;
                        suffix = "-";
                    }
                    else {
                        while( itEnd > it && wrappableInsteadOfChars.find( *(itEnd-1) ) != std::string::npos )
                            --itEnd;
                    }
                }
                lines.push_back( indent + std::string( it, itEnd ) + suffix );

                if( indent.size() != _attr.indent )
                    indent = std::string( _attr.indent, ' ' );
                it = itNext;
            }
        }